

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport.c
# Opt level: O0

nni_sp_tran * nni_sp_tran_find(char *url)

{
  int iVar1;
  size_t __n;
  size_t len;
  nni_sp_tran *t;
  char *url_local;
  
  len = (size_t)nni_list_first(&sp_tran_list);
  while( true ) {
    if (len == 0) {
      return (nni_sp_tran *)0x0;
    }
    __n = strlen(*(char **)(len + 0x10));
    iVar1 = strncmp(url,*(char **)(len + 0x10),__n);
    if ((iVar1 == 0) && ((url[__n] == ':' || (url[__n] == '\0')))) break;
    len = (size_t)nni_list_next(&sp_tran_list,(void *)len);
  }
  return (nni_sp_tran *)len;
}

Assistant:

nni_sp_tran *
nni_sp_tran_find(const char *url)
{
	// address is of the form "<scheme>://blah..."
	nni_sp_tran *t;

	NNI_LIST_FOREACH (&sp_tran_list, t) {
		size_t len = strlen(t->tran_scheme);
		if ((strncmp(url, t->tran_scheme, len) == 0) &&
		    (url[len] == ':' || url[len] == '\0')) {
			return (t);
		}
	}
	return (NULL);
}